

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *coScaleval,
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *scaleval,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *epsilon)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  long lVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  type pcVar8;
  double *pdVar9;
  fpclass_type fVar10;
  long lVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar13;
  long *plVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxi;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<50U,_int,_void> local_238;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> *local_1c0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  undefined1 local_178 [16];
  uint local_168 [3];
  undefined3 uStack_15b;
  uint local_158 [3];
  bool local_14c;
  undefined8 local_148;
  double local_140;
  cpp_dec_float<50U,_int,_void> local_138;
  soplex *local_100;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_f8;
  long local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  pointer local_68;
  pointer pnStack_60;
  pointer local_58;
  pointer pnStack_50;
  pointer local_48;
  int local_40;
  bool local_3c;
  pointer local_38;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  pcVar1 = &__return_storage_ptr__->m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined1 (*) [16])((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) =
       (undefined1  [16])0x0;
  local_1c0 = &__return_storage_ptr__->m_backend;
  local_f8 = coScaleval;
  pcVar8 = boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                     ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,0.0);
  if (0 < *(int *)(this + 0x38)) {
    pdVar9 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_140 = *pdVar9;
    local_f0 = 0;
    local_100 = this;
    do {
      plVar14 = (long *)((long)*(int *)(*(long *)(local_100 + 0x28) + 4 + local_f0 * 8) * 0x28 +
                        *(long *)(local_100 + 0x20));
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems._24_5_ = 0;
      local_138.data._M_elems[7]._1_3_ = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.exp = 0;
      local_138.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_138,0.0);
      ::soplex::infinity::__tls_init();
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 10;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems._24_5_ = 0;
      local_1b8.data._M_elems[7]._1_3_ = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1b8,local_140);
      if (0 < *(int *)((long)plVar14 + 0xc)) {
        lVar13 = 0;
        lVar11 = 0;
        do {
          lVar3 = *plVar14;
          pcVar1 = (cpp_dec_float<50U,_int,_void> *)(lVar3 + lVar13);
          pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                    ((vecset->
                     super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._vptr_ClassArray + (ulong)*(uint *)(lVar3 + 0x38 + lVar13) * 7);
          local_148._0_4_ = cpp_dec_float_finite;
          local_148._4_4_ = 10;
          local_178 = (undefined1  [16])0x0;
          local_168[0] = 0;
          local_168[1] = 0;
          stack0xfffffffffffffea0 = 0;
          uStack_15b = 0;
          local_158[0] = 0;
          local_158[1] = 0;
          local_158[2] = 0;
          local_14c = false;
          v = pcVar1;
          if (((cpp_dec_float<50U,_int,_void> *)local_178 != pcVar12) &&
             (v = pcVar12, pcVar1 != (cpp_dec_float<50U,_int,_void> *)local_178)) {
            local_158._0_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_178 = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
            local_168._0_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            stack0xfffffffffffffea0 = (undefined5)uVar5;
            uStack_15b = (undefined3)((ulong)uVar5 >> 0x28);
            local_158[2] = *(int *)(lVar3 + 0x28 + lVar13);
            local_14c = *(bool *)(lVar3 + 0x2c + lVar13);
            local_148 = *(undefined8 *)(lVar3 + 0x30 + lVar13);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_178,v);
          local_238.data._M_elems[0] = local_178._0_4_;
          local_238.data._M_elems[1] = local_178._4_4_;
          local_238.data._M_elems[2] = local_178._8_4_;
          local_238.data._M_elems[3] = local_178._12_4_;
          auVar6 = (undefined1  [16])local_238.data._M_elems._0_16_;
          local_238.data._M_elems[4] = local_168[0];
          local_238.data._M_elems[5] = local_168[1];
          local_238.data._M_elems._24_5_ = stack0xfffffffffffffea0;
          local_238.data._M_elems[7]._1_3_ = uStack_15b;
          local_238.data._M_elems._32_5_ = SUB85(local_158._0_8_,0);
          local_238.data._M_elems[9]._1_3_ = SUB83(local_158._0_8_,5);
          local_238.exp = local_158[2];
          local_238.neg = local_14c;
          fVar10 = (fpclass_type)local_148;
          local_238.fpclass = (fpclass_type)local_148;
          local_238.prec_elem = local_148._4_4_;
          local_238.data._M_elems[0] = local_178._0_4_;
          if ((local_14c == true) &&
             (local_238.data._M_elems[0] != 0 || fVar10 != cpp_dec_float_finite)) {
            local_238.neg = false;
          }
          local_1f8.data._M_elems[4] = local_168[0];
          local_1f8.data._M_elems[5] = local_168[1];
          local_1f8.data._M_elems._24_5_ = stack0xfffffffffffffea0;
          local_1f8.data._M_elems[7]._1_3_ = uStack_15b;
          local_1f8.data._M_elems[0] = local_178._0_4_;
          local_1f8.data._M_elems[1] = local_178._4_4_;
          local_1f8.data._M_elems[2] = local_178._8_4_;
          local_1f8.data._M_elems[3] = local_178._12_4_;
          local_68 = (scaleval->
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          pnStack_60 = (scaleval->
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
          local_58 = (scaleval->
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage;
          pnStack_50 = scaleval[1].
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          local_48 = scaleval[1].
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          local_40 = *(int *)&scaleval[1].
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_3c = *(bool *)((long)&scaleval[1].
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
          local_38 = scaleval[2].
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_1f8.exp = local_158[2];
          local_1f8.fpclass = (fpclass_type)local_148;
          local_1f8.prec_elem = local_148._4_4_;
          local_1f8.neg = local_238.neg;
          if ((local_238.neg != false) &&
             (local_238.data._M_elems[0] != 0 || fVar10 != cpp_dec_float_finite)) {
            local_1f8.neg = (bool)(local_238.neg ^ 1);
          }
          local_238.data._M_elems._0_16_ = auVar6;
          local_1f8.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
          local_1f8.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
          if ((int)local_38 == 2 || fVar10 == cpp_dec_float_NaN) {
LAB_0017b7af:
            if ((fVar10 != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)) {
              iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_238,&local_138);
              fVar10 = local_238.fpclass;
              if (0 < iVar7) {
                local_138.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
                local_138.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
                local_138.data._M_elems[4] = local_238.data._M_elems[4];
                local_138.data._M_elems[5] = local_238.data._M_elems[5];
                local_138.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
                local_138.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
                local_138.data._M_elems[0] = local_238.data._M_elems[0];
                local_138.data._M_elems[1] = local_238.data._M_elems[1];
                local_138.data._M_elems[2] = local_238.data._M_elems[2];
                local_138.data._M_elems[3] = local_238.data._M_elems[3];
                local_138.exp = local_238.exp;
                local_138.neg = local_238.neg;
                local_138.fpclass = local_238.fpclass;
                local_138.prec_elem = local_238.prec_elem;
              }
            }
            if (((fVar10 != cpp_dec_float_NaN) && (local_1b8.fpclass != cpp_dec_float_NaN)) &&
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_238,&local_1b8), iVar7 < 0)) {
              local_1b8.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
              local_1b8.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
              local_1b8.data._M_elems[4] = local_238.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_238.data._M_elems[5];
              local_1b8.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
              local_1b8.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
              local_1b8.data._M_elems[0] = local_238.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_238.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_238.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_238.data._M_elems[3];
              local_1b8.exp = local_238.exp;
              local_1b8.neg = local_238.neg;
              local_1b8.fpclass = local_238.fpclass;
              local_1b8.prec_elem = local_238.prec_elem;
            }
          }
          else {
            iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1f8,(cpp_dec_float<50U,_int,_void> *)&local_68);
            if (0 < iVar7) {
              fVar10 = local_238.fpclass;
              goto LAB_0017b7af;
            }
          }
          lVar11 = lVar11 + 1;
          lVar13 = lVar13 + 0x3c;
        } while (lVar11 < *(int *)((long)plVar14 + 0xc));
      }
      ::soplex::infinity::__tls_init();
      local_238.fpclass = cpp_dec_float_finite;
      local_238.prec_elem = 10;
      local_238.data._M_elems[0] = 0;
      local_238.data._M_elems[1] = 0;
      local_238.data._M_elems[2] = 0;
      local_238.data._M_elems[3] = 0;
      local_238.data._M_elems[4] = 0;
      local_238.data._M_elems[5] = 0;
      local_238.data._M_elems._24_5_ = 0;
      local_238.data._M_elems[7]._1_3_ = 0;
      local_238.data._M_elems._32_5_ = 0;
      local_238.data._M_elems[9]._1_3_ = 0;
      local_238.exp = 0;
      local_238.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_238,local_140);
      lVar11 = local_f0;
      if (((local_1b8.fpclass == cpp_dec_float_NaN) || (local_238.fpclass == cpp_dec_float_NaN)) ||
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1b8,&local_238), iVar7 != 0)) {
        if (local_138.fpclass != cpp_dec_float_NaN) {
          local_1f8.fpclass = cpp_dec_float_finite;
          local_1f8.prec_elem = 10;
          local_1f8.data._M_elems._0_16_ = ZEXT816(0);
          local_1f8.data._M_elems[4] = 0;
          local_1f8.data._M_elems[5] = 0;
          local_1f8.data._M_elems._24_5_ = 0;
          local_1f8.data._M_elems[7]._1_3_ = 0;
          local_1f8.data._M_elems._32_5_ = 0;
          local_1f8.data._M_elems[9]._1_3_ = 0;
          local_1f8.exp = 0;
          local_1f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1f8,0.0);
          iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_138,&local_1f8);
          if (iVar7 == 0) goto LAB_0017b97f;
        }
      }
      else {
LAB_0017b97f:
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1b8,1.0);
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_138,1.0);
      }
      auVar6 = (undefined1  [16])local_1b8.data._M_elems._0_16_;
      local_e8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
      local_e8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
      local_e8.data._M_elems[0] = local_1b8.data._M_elems[0];
      local_e8.data._M_elems[1] = local_1b8.data._M_elems[1];
      local_e8.data._M_elems[2] = local_1b8.data._M_elems[2];
      local_e8.data._M_elems[3] = local_1b8.data._M_elems[3];
      local_e8.data._M_elems[4] = local_1b8.data._M_elems[4];
      local_e8.data._M_elems[5] = local_1b8.data._M_elems[5];
      local_e8.data._M_elems[8] = local_1b8.data._M_elems[8];
      local_e8.data._M_elems[9] = local_1b8.data._M_elems[9];
      local_e8.exp = local_1b8.exp;
      local_e8.neg = local_1b8.neg;
      local_e8.fpclass = local_1b8.fpclass;
      local_e8.prec_elem = local_1b8.prec_elem;
      local_1b8.data._M_elems._0_16_ = auVar6;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_e8,&local_138);
      local_a8.data._M_elems[0] = local_e8.data._M_elems[0];
      local_a8.data._M_elems[1] = local_e8.data._M_elems[1];
      local_a8.data._M_elems[2] = local_e8.data._M_elems[2];
      local_a8.data._M_elems[3] = local_e8.data._M_elems[3];
      local_a8.data._M_elems[4] = local_e8.data._M_elems[4];
      local_a8.data._M_elems[5] = local_e8.data._M_elems[5];
      local_a8.data._M_elems[6] = local_e8.data._M_elems[6];
      local_a8.data._M_elems[7] = local_e8.data._M_elems[7];
      local_a8.data._M_elems[8] = local_e8.data._M_elems[8];
      local_a8.data._M_elems[9] = local_e8.data._M_elems[9];
      local_a8.exp = local_e8.exp;
      local_a8.neg = local_e8.neg;
      local_a8.fpclass = local_e8.fpclass;
      local_a8.prec_elem = local_e8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::calculate_sqrt(&local_a8);
      local_238.fpclass = cpp_dec_float_finite;
      local_238.prec_elem = 10;
      local_238.data._M_elems._0_16_ = ZEXT816(0);
      local_238.data._M_elems[4] = 0;
      local_238.data._M_elems[5] = 0;
      local_238.data._M_elems._24_5_ = 0;
      local_238.data._M_elems[7]._1_3_ = 0;
      local_238.data._M_elems._32_5_ = 0;
      local_238.data._M_elems[9]._1_3_ = 0;
      local_238.exp = 0;
      local_238.neg = false;
      local_1f8.fpclass = cpp_dec_float_finite;
      local_1f8.prec_elem = 10;
      local_1f8.data._M_elems._0_16_ = ZEXT816(0);
      local_1f8.data._M_elems[4] = 0;
      local_1f8.data._M_elems[5] = 0;
      local_1f8.data._M_elems._24_5_ = 0;
      local_1f8.data._M_elems[7]._1_3_ = 0;
      local_1f8.data._M_elems._32_5_ = 0;
      local_1f8.data._M_elems[9]._1_3_ = 0;
      local_1f8.exp = 0;
      local_1f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1f8,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_238,&local_1f8,&local_a8);
      pnVar4 = (local_f8->
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)pnVar4[lVar11].m_backend.data._M_elems + 0x20) =
           CONCAT35(local_238.data._M_elems[9]._1_3_,local_238.data._M_elems._32_5_);
      puVar2 = (uint *)((long)pnVar4[lVar11].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar2 = local_238.data._M_elems._16_8_;
      *(ulong *)(puVar2 + 2) =
           CONCAT35(local_238.data._M_elems[7]._1_3_,local_238.data._M_elems._24_5_);
      *(undefined8 *)pnVar4[lVar11].m_backend.data._M_elems = local_238.data._M_elems._0_8_;
      *(undefined8 *)((long)pnVar4[lVar11].m_backend.data._M_elems + 8) =
           local_238.data._M_elems._8_8_;
      pnVar4[lVar11].m_backend.exp = local_238.exp;
      pnVar4[lVar11].m_backend.neg = local_238.neg;
      pnVar4[lVar11].m_backend.fpclass = local_238.fpclass;
      pnVar4[lVar11].m_backend.prec_elem = local_238.prec_elem;
      local_1f8.fpclass = cpp_dec_float_finite;
      local_1f8.prec_elem = 10;
      local_1f8.data._M_elems[0] = 0;
      local_1f8.data._M_elems[1] = 0;
      local_1f8.data._M_elems[2] = 0;
      local_1f8.data._M_elems[3] = 0;
      local_1f8.data._M_elems[4] = 0;
      local_1f8.data._M_elems[5] = 0;
      local_1f8.data._M_elems._24_5_ = 0;
      local_1f8.data._M_elems[7]._1_3_ = 0;
      local_1f8.data._M_elems._32_5_ = 0;
      local_1f8.data._M_elems[9]._1_3_ = 0;
      local_1f8.exp = 0;
      local_1f8.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_1f8,&local_138,&local_1b8);
      if (((local_1f8.fpclass != cpp_dec_float_NaN) && (local_1c0->fpclass != cpp_dec_float_NaN)) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1f8,local_1c0), 0 < iVar7)) {
        *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_1c0->data)->data)._M_elems + 8) =
             CONCAT35(local_1f8.data._M_elems[9]._1_3_,local_1f8.data._M_elems._32_5_);
        *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_1c0->data)->data)._M_elems + 4) =
             local_1f8.data._M_elems._16_8_;
        *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_1c0->data)->data)._M_elems + 6) =
             CONCAT35(local_1f8.data._M_elems[7]._1_3_,local_1f8.data._M_elems._24_5_);
        *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_1c0->data)->data)._M_elems =
             local_1f8.data._M_elems._0_8_;
        *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_1c0->data)->data)._M_elems + 2) =
             local_1f8.data._M_elems._8_8_;
        local_1c0->exp = local_1f8.exp;
        local_1c0->neg = local_1f8.neg;
        local_1c0->fpclass = local_1f8.fpclass;
        local_1c0->prec_elem = local_1f8.prec_elem;
      }
      local_f0 = lVar11 + 1;
      pcVar8 = (type)(long)*(int *)(local_100 + 0x38);
    } while (local_f0 < (long)pcVar8);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)pcVar8;
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}